

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

int __thiscall
Centaurus::NFA<wchar_t>::select
          (NFA<wchar_t> *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  bool bVar1;
  int extraout_EAX;
  size_type sVar2;
  reference pvVar3;
  pointer this_00;
  const_reference src;
  undefined4 in_register_00000034;
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  *this_01;
  CharClass<wchar_t> local_d8;
  CharClass<wchar_t> local_b8;
  NFABaseState<wchar_t,_int> *local_98;
  NFABaseState<wchar_t,_int> local_90;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_68;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_60;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  local_58;
  __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
  i;
  CharClass<wchar_t> local_40;
  int local_1c;
  long lStack_18;
  int initial_size;
  NFA<wchar_t> *nfa_local;
  NFA<wchar_t> *this_local;
  
  lStack_18 = CONCAT44(in_register_00000034,__nfds);
  this_01 = &(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states;
  nfa_local = this;
  sVar2 = std::
          vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
          ::size(this_01);
  local_1c = (int)sVar2;
  pvVar3 = std::
           vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
           ::operator[](this_01,0);
  CharClass<wchar_t>::CharClass(&local_40);
  NFABaseState<wchar_t,_int>::add_transition(pvVar3,&local_40,local_1c,false);
  CharClass<wchar_t>::~CharClass(&local_40);
  local_60._M_current =
       (NFABaseState<wchar_t,_int> *)
       std::
       vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
       ::cbegin((vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                 *)(lStack_18 + 8));
  local_58 = __gnu_cxx::
             __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
             ::operator+(&local_60,1);
  while( true ) {
    local_68._M_current =
         (NFABaseState<wchar_t,_int> *)
         std::
         vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
         ::cend((vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                 *)(lStack_18 + 8));
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
              ::operator->(&local_58);
    NFABaseState<wchar_t,_int>::offset(&local_90,this_00,local_1c + -1);
    std::
    vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
    ::push_back(&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,&local_90);
    NFABaseState<wchar_t,_int>::~NFABaseState(&local_90);
    local_98 = (NFABaseState<wchar_t,_int> *)
               __gnu_cxx::
               __normal_iterator<const_Centaurus::NFABaseState<wchar_t,_int>_*,_std::vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>_>
               ::operator++(&local_58,0);
  }
  pvVar3 = std::
           vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
           ::operator[](&(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states,0);
  src = std::
        vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
        ::operator[]((vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                      *)(lStack_18 + 8),0);
  NFABaseState<wchar_t,_int>::rebase_transitions(pvVar3,src,local_1c + -1);
  CharClass<wchar_t>::CharClass(&local_b8);
  add_state(this,&local_b8);
  CharClass<wchar_t>::~CharClass(&local_b8);
  CharClass<wchar_t>::CharClass(&local_d8);
  add_transition_from(this,&local_d8,local_1c + -1);
  CharClass<wchar_t>::~CharClass(&local_d8);
  return extraout_EAX;
}

Assistant:

CharClass(Stream& stream)
    {
        parse(stream);
    }